

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

int Gia_QbfAddCofactor(Qbf_Man_t *p,Gia_Man_t *pCof)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  Cnf_Dat_t *p_00;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(pCof,8,0,1,0,0);
  iVar9 = (pCof->nRegs - pCof->vCis->nSize) + p_00->nVars;
  p_00->pMan = (Aig_Man_t *)0x0;
  iVar5 = sat_solver_nvars(p->pSatSyn);
  if (0 < p_00->nLiterals) {
    iVar1 = p->pGia->nRegs;
    iVar2 = p->pGia->vCis->nSize;
    piVar4 = *p_00->pClauses;
    lVar6 = 0;
    do {
      iVar3 = piVar4[lVar6];
      iVar7 = iVar3 / 2;
      iVar8 = iVar9 * -2;
      if ((iVar9 - iVar1) + iVar2 <= iVar7) {
        iVar8 = iVar5 * 2;
      }
      if (iVar7 < iVar9) {
        iVar8 = iVar5 * 2;
      }
      piVar4[lVar6] = iVar8 + iVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 < p_00->nLiterals);
  }
  lVar6 = 0;
  do {
    if (p_00->nClauses <= lVar6) {
      iVar5 = 1;
      goto LAB_007a0bb2;
    }
    iVar5 = sat_solver_addclause(p->pSatSyn,p_00->pClauses[lVar6],p_00->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
  } while (iVar5 != 0);
  iVar5 = 0;
LAB_007a0bb2:
  Cnf_DataFree(p_00);
  return iVar5;
}

Assistant:

int Gia_QbfAddCofactor( Qbf_Man_t * p, Gia_Man_t * pCof )
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pCof, 8, 0, 1, 0, 0 );
    int i, useold = 0;
    int iFirstVar = useold ? sat_solver_nvars(p->pSatSyn) + pCnf->nVars - Gia_ManPiNum(pCof) : pCnf->nVars - Gia_ManPiNum(pCof); //-1   
    pCnf->pMan = NULL;
    
    if (useold)    
        Cnf_DataLift( pCnf, sat_solver_nvars(p->pSatSyn) );
    else
        Cnf_SpecialDataLift( pCnf, sat_solver_nvars(p->pSatSyn), iFirstVar, iFirstVar + Gia_ManPiNum(p->pGia) );

    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( p->pSatSyn, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
        {
            Cnf_DataFree( pCnf );
            return 0;
        }
    Cnf_DataFree( pCnf );
    // add connection clauses
    if (useold)
           for ( i = 0; i < Gia_ManPiNum(p->pGia); i++ )
            if ( !sat_solver_add_buffer( p->pSatSyn, i, iFirstVar+i, 0 ) )
                return 0;
    return 1;
}